

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsimd.c
# Opt level: O2

void jsimd_ycc_rgb_convert
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
               JSAMPARRAY output_buf,int num_rows)

{
  uint uVar1;
  code *UNRECOVERED_JUMPTABLE;
  code *pcVar2;
  
  uVar1 = cinfo->out_color_space - JCS_EXT_RGB;
  if (uVar1 < 10) {
    UNRECOVERED_JUMPTABLE = (code *)(&PTR_jsimd_ycc_extrgb_convert_avx2_0018aa90)[uVar1];
    pcVar2 = (code *)(&PTR_jsimd_ycc_extrgb_convert_sse2_0018aae0)[uVar1];
  }
  else {
    pcVar2 = jsimd_ycc_rgb_convert_sse2;
    UNRECOVERED_JUMPTABLE = jsimd_ycc_rgb_convert_avx2;
  }
  if (-1 < (char)simd_support) {
    UNRECOVERED_JUMPTABLE = pcVar2;
  }
  (*UNRECOVERED_JUMPTABLE)(cinfo->output_width);
  return;
}

Assistant:

GLOBAL(void)
jsimd_ycc_rgb_convert(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                      JDIMENSION input_row, JSAMPARRAY output_buf,
                      int num_rows)
{
  void (*avx2fct) (JDIMENSION, JSAMPIMAGE, JDIMENSION, JSAMPARRAY, int);
  void (*sse2fct) (JDIMENSION, JSAMPIMAGE, JDIMENSION, JSAMPARRAY, int);

  switch (cinfo->out_color_space) {
  case JCS_EXT_RGB:
    avx2fct = jsimd_ycc_extrgb_convert_avx2;
    sse2fct = jsimd_ycc_extrgb_convert_sse2;
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    avx2fct = jsimd_ycc_extrgbx_convert_avx2;
    sse2fct = jsimd_ycc_extrgbx_convert_sse2;
    break;
  case JCS_EXT_BGR:
    avx2fct = jsimd_ycc_extbgr_convert_avx2;
    sse2fct = jsimd_ycc_extbgr_convert_sse2;
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    avx2fct = jsimd_ycc_extbgrx_convert_avx2;
    sse2fct = jsimd_ycc_extbgrx_convert_sse2;
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    avx2fct = jsimd_ycc_extxbgr_convert_avx2;
    sse2fct = jsimd_ycc_extxbgr_convert_sse2;
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    avx2fct = jsimd_ycc_extxrgb_convert_avx2;
    sse2fct = jsimd_ycc_extxrgb_convert_sse2;
    break;
  default:
    avx2fct = jsimd_ycc_rgb_convert_avx2;
    sse2fct = jsimd_ycc_rgb_convert_sse2;
    break;
  }

  if (simd_support & JSIMD_AVX2)
    avx2fct(cinfo->output_width, input_buf, input_row, output_buf, num_rows);
  else
    sse2fct(cinfo->output_width, input_buf, input_row, output_buf, num_rows);
}